

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  byte bVar1;
  char *pPtr;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((pIdList != (IdList *)0x0) && (iVar2 = pIdList->nId, 0 < iVar2)) {
    lVar4 = 0;
    do {
      pPtr = pIdList->a[lVar4].zName;
      if (pPtr == (char *)0x0) {
        if (zOld == (char *)0x0) {
LAB_001ba310:
          renameTokenFind(pParse,pCtx,pPtr);
          iVar2 = pIdList->nId;
        }
      }
      else if (zOld != (char *)0x0) {
        lVar3 = 0;
        do {
          bVar1 = pPtr[lVar3];
          if (bVar1 == zOld[lVar3]) {
            if ((ulong)bVar1 == 0) goto LAB_001ba310;
          }
          else if (""[bVar1] != ""[(byte)zOld[lVar3]]) break;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const IdList *pIdList,
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      const char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}